

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacklib.c
# Opt level: O1

boolean piday(void)

{
  tm *ptVar1;
  bool bVar2;
  
  ptVar1 = getlt();
  if ((ptVar1->tm_mon == 2) && (ptVar1 = getlt(), ptVar1->tm_mday == 0xe)) {
    return '\x01';
  }
  ptVar1 = getlt();
  if (ptVar1->tm_mday == 0x16) {
    ptVar1 = getlt();
    bVar2 = ptVar1->tm_mon == 6;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

boolean piday(void)
{
	return (boolean)(
		(getmonth() == 3 && getmday() == 14) ||	/* Pi Day */
		(getmday() == 22 && getmonth() == 7));	/* Pi Approximation Day */
}